

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O0

void Dam_ManCreateMultiRefs(Dam_Man_t *p,Vec_Int_t **pvRefsAnd,Vec_Int_t **pvRefsXor)

{
  int iVar1;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  int *piVar2;
  bool bVar3;
  int *pSet;
  int k;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vRefsXor;
  Vec_Int_t *vRefsAnd;
  Vec_Int_t **pvRefsXor_local;
  Vec_Int_t **pvRefsAnd_local;
  Dam_Man_t *p_local;
  
  iVar1 = Gia_ManObjNum(p->pGia);
  p_00 = Vec_IntStart(iVar1 << 1);
  iVar1 = Gia_ManObjNum(p->pGia);
  p_01 = Vec_IntStart(iVar1);
  pSet._4_4_ = 0;
  while( true ) {
    bVar3 = false;
    if (pSet._4_4_ < p->pGia->nObjs) {
      _k = Gia_ManObj(p->pGia,pSet._4_4_);
      bVar3 = _k != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    iVar1 = Gia_ObjIsAnd(_k);
    if ((iVar1 != 0) && (iVar1 = Dam_ObjHand(p,pSet._4_4_), iVar1 != 0)) {
      piVar2 = Dam_ObjSet(p,pSet._4_4_);
      iVar1 = Gia_ObjIsXor(_k);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsAndReal(p->pGia,_k);
        if (iVar1 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalAig.c"
                        ,0x25a,
                        "void Dam_ManCreateMultiRefs(Dam_Man_t *, Vec_Int_t **, Vec_Int_t **)");
        }
        for (pSet._0_4_ = 1; (int)pSet <= *piVar2; pSet._0_4_ = (int)pSet + 1) {
          Vec_IntAddToEntry(p_00,piVar2[(int)pSet],1);
        }
      }
      else {
        for (pSet._0_4_ = 1; (int)pSet <= *piVar2; pSet._0_4_ = (int)pSet + 1) {
          iVar1 = Abc_LitIsCompl(piVar2[(int)pSet]);
          if (iVar1 != 0) {
            __assert_fail("!Abc_LitIsCompl(pSet[k])",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalAig.c"
                          ,0x254,
                          "void Dam_ManCreateMultiRefs(Dam_Man_t *, Vec_Int_t **, Vec_Int_t **)");
          }
          iVar1 = Abc_Lit2Var(piVar2[(int)pSet]);
          Vec_IntAddToEntry(p_01,iVar1,1);
        }
      }
    }
    pSet._4_4_ = pSet._4_4_ + 1;
  }
  *pvRefsAnd = p_00;
  *pvRefsXor = p_01;
  return;
}

Assistant:

void Dam_ManCreateMultiRefs( Dam_Man_t * p, Vec_Int_t ** pvRefsAnd, Vec_Int_t ** pvRefsXor )  
{
    Vec_Int_t * vRefsAnd, * vRefsXor;
    Gia_Obj_t * pObj;
    int i, k, * pSet;
    vRefsAnd = Vec_IntStart( 2 * Gia_ManObjNum(p->pGia) );
    vRefsXor = Vec_IntStart( Gia_ManObjNum(p->pGia) );
    Gia_ManForEachAnd( p->pGia, pObj, i )
    {
        if ( !Dam_ObjHand(p, i) )
            continue;
        pSet = Dam_ObjSet(p, i);
        if ( Gia_ObjIsXor(pObj) )
            for ( k = 1; k <= pSet[0]; k++ )
            {
                assert( !Abc_LitIsCompl(pSet[k]) );
                Vec_IntAddToEntry( vRefsXor, Abc_Lit2Var(pSet[k]), 1 );
            }
        else if ( Gia_ObjIsAndReal(p->pGia, pObj) )
            for ( k = 1; k <= pSet[0]; k++ )
                Vec_IntAddToEntry( vRefsAnd, pSet[k], 1 );
        else assert( 0 );
    }
    *pvRefsAnd = vRefsAnd;
    *pvRefsXor = vRefsXor;
}